

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScrollableWindow.cpp
# Opt level: O2

void __thiscall
cursespp::ScrollableWindow::ScrollableWindow
          (ScrollableWindow *this,shared_ptr<cursespp::IScrollAdapter> *adapter,IWindow *parent)

{
  Window::Window(&this->super_Window,parent);
  (this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable =
       (_func_int **)&PTR__ScrollableWindow_001c0f50;
  (this->super_Window).super_IWindow.super_IDisplayable._vptr_IDisplayable =
       (_func_int **)&PTR__ScrollableWindow_001c1180;
  (this->super_Window).super_IWindow.super_IMouseHandler._vptr_IMouseHandler =
       (_func_int **)&PTR__ScrollableWindow_001c11b0;
  (this->super_Window).super_IWindow.super_IMessageTarget._vptr_IMessageTarget =
       (_func_int **)&PTR__ScrollableWindow_001c11d8;
  (this->super_IScrollable)._vptr_IScrollable = (_func_int **)&PTR__ScrollableWindow_001c1200;
  (this->super_IKeyHandler)._vptr_IKeyHandler = (_func_int **)&PTR__ScrollableWindow_001c1250;
  std::__shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->adapter).
              super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>,
             &adapter->super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>);
  *(undefined8 *)((long)&(this->scrollPosition).totalEntries + 1) = 0;
  *(undefined8 *)((long)&(this->scrollPosition).logicalIndex + 1) = 0;
  (this->scrollPosition).lineCount = 0;
  (this->scrollPosition).totalEntries = 0;
  (this->scrollPosition).firstVisibleEntryIndex = 0;
  (this->scrollPosition).visibleEntryCount = 0;
  return;
}

Assistant:

ScrollableWindow::ScrollableWindow(std::shared_ptr<IScrollAdapter> adapter, IWindow *parent)
: Window(parent)
, adapter(adapter)
, allowArrowKeyPropagation(false) {
}